

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

QSize __thiscall QtMWidgets::PickerPrivate::minimumSizeHint(PickerPrivate *this,QStyleOption *opt)

{
  int iVar1;
  int widgetHeight;
  int widgetWidth;
  int minStringWidth;
  QLatin1String local_58;
  QString local_48;
  QRect local_30;
  QStyleOption *local_20;
  QStyleOption *opt_local;
  PickerPrivate *this_local;
  
  local_20 = opt;
  opt_local = (QStyleOption *)this;
  QLatin1String::QLatin1String(&local_58,"A");
  QString::QString(&local_48,local_58);
  local_30 = (QRect)QFontMetrics::boundingRect((QString *)(opt + 0x20));
  iVar1 = QRect::height(&local_30);
  this->stringHeight = iVar1;
  QString::~QString(&local_48);
  iVar1 = QFontMetrics::averageCharWidth();
  this->itemSideMargin = iVar1 * 3;
  this->itemTopMargin = this->stringHeight / 3;
  iVar1 = QFontMetrics::averageCharWidth();
  QSize::QSize((QSize *)&this_local,iVar1 * (this->minStringLength + 2) + this->itemSideMargin * 2,
               (this->stringHeight + this->itemTopMargin) * this->itemsCount - this->itemTopMargin);
  return (QSize)this_local;
}

Assistant:

QSize
PickerPrivate::minimumSizeHint( const QStyleOption & opt )
{
	stringHeight = opt.fontMetrics.boundingRect( QLatin1String( "A" ) ).height();

	itemSideMargin = opt.fontMetrics.averageCharWidth() * 3;

	itemTopMargin = stringHeight / 3;

	const int minStringWidth = opt.fontMetrics.averageCharWidth() *
		( minStringLength + 2 );
	const int widgetWidth = minStringWidth + 2 * itemSideMargin;
	const int widgetHeight = ( stringHeight + itemTopMargin ) *
		itemsCount - itemTopMargin;

	return QSize( widgetWidth, widgetHeight );
}